

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O2

int https_connect(HTTP_INFO *hi,char *host,char *port)

{
  mbedtls_entropy_context *ctx;
  mbedtls_ctr_drbg_context *ctx_00;
  mbedtls_x509_crt *chain;
  mbedtls_ssl_config *conf;
  mbedtls_ssl_context *pmVar1;
  mbedtls_net_context *ctx_01;
  BOOL BVar2;
  addrinfo *paVar3;
  HTTP_INFO *pHVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  int *piVar9;
  long lVar10;
  int fd;
  addrinfo **__pai;
  int opt;
  HTTP_INFO *local_110;
  addrinfo *addr_list;
  socklen_t slen;
  timeval tv;
  fd_set local_e8;
  addrinfo local_68;
  
  BVar2 = (hi->url).https;
  if (BVar2 == '\x01') {
    ctx = &(hi->tls).entropy;
    mbedtls_entropy_init(ctx);
    ctx_00 = &(hi->tls).ctr_drbg;
    iVar5 = mbedtls_ctr_drbg_seed(ctx_00,mbedtls_entropy_func,ctx,(uchar *)0x0,0);
    if (iVar5 != 0) {
      return iVar5;
    }
    ca_crt_rsa[0x112e0] = '\0';
    chain = &(hi->tls).cacert;
    iVar5 = mbedtls_x509_crt_parse(chain,(uchar *)ca_crt_rsa,0x112e1);
    if (iVar5 != 0) {
      return iVar5;
    }
    conf = &(hi->tls).conf;
    iVar5 = mbedtls_ssl_config_defaults(conf,0,0,0);
    if (iVar5 != 0) {
      return iVar5;
    }
    mbedtls_ssl_conf_authmode(conf,1);
    mbedtls_ssl_conf_ca_chain(conf,chain,(mbedtls_x509_crl *)0x0);
    mbedtls_ssl_conf_rng(conf,mbedtls_ctr_drbg_random,ctx_00);
    mbedtls_ssl_conf_read_timeout(conf,5000);
    pmVar1 = &(hi->tls).ssl;
    iVar5 = mbedtls_ssl_setup(pmVar1,conf);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = mbedtls_ssl_set_hostname(pmVar1,host);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  signal(0xd,(__sighandler_t)0x1);
  local_68.ai_flags = 0;
  local_68.ai_family = 0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 6;
  __pai = (addrinfo **)&addr_list;
  iVar5 = getaddrinfo(host,port,&local_68,__pai);
  if (iVar5 != 0) {
    return -0x52;
  }
  ctx_01 = &(hi->tls).ssl_fd;
  uVar7 = 0xffffffae;
  local_110 = hi;
  while (paVar3 = *__pai, paVar3 != (addrinfo *)0x0) {
    iVar5 = socket(paVar3->ai_family,paVar3->ai_socktype,paVar3->ai_protocol);
    ctx_01->fd = iVar5;
    uVar7 = 0xffffffbe;
    if (-1 < iVar5) {
      iVar6 = mbedtls_net_set_nonblock(ctx_01);
      iVar5 = ctx_01->fd;
      if (iVar6 < 0) goto LAB_00110fae;
      iVar5 = connect(iVar5,paVar3->ai_addr,paVar3->ai_addrlen);
      if (iVar5 == 0) {
        uVar7 = 0;
        break;
      }
      piVar9 = __errno_location();
      iVar5 = ctx_01->fd;
      if (*piVar9 == 0x73) {
        lVar10 = 0;
        uVar7 = 0xffffffff;
        goto LAB_00110f29;
      }
      close(iVar5);
      ctx_01->fd = -1;
      uVar7 = 0xffffffbc;
    }
    __pai = &paVar3->ai_next;
  }
  goto LAB_00110fba;
  while (lVar10 = 0, *piVar9 == 4) {
LAB_00110f29:
    for (; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      local_e8.fds_bits[lVar10] = 0;
    }
    local_e8.fds_bits[iVar5 / 0x40] = local_e8.fds_bits[iVar5 / 0x40] | 1L << ((byte)iVar5 & 0x3f);
    tv.tv_sec = 5;
    tv.tv_usec = 0;
    iVar6 = select(iVar5 + 1,(fd_set *)0x0,&local_e8,(fd_set *)0x0,(timeval *)&tv);
    if (iVar6 != -1) {
      if (iVar6 == 0) goto LAB_00110fae;
      slen = 4;
      iVar6 = getsockopt(iVar5,1,4,&opt,&slen);
      uVar7 = 0;
      if ((iVar6 == 0) && (0 < opt)) {
LAB_00110fae:
        close(iVar5);
        ctx_01->fd = -1;
        uVar7 = 0xffffffbc;
      }
      break;
    }
  }
LAB_00110fba:
  freeaddrinfo((addrinfo *)addr_list);
  if (uVar7 == 0) {
    iVar5 = mbedtls_net_set_block(ctx_01);
    pHVar4 = local_110;
    if (iVar5 < 0) {
      close(ctx_01->fd);
      ctx_01->fd = -1;
      uVar7 = 0xffffffbc;
    }
    else if (BVar2 == '\x01') {
      pmVar1 = &(local_110->tls).ssl;
      mbedtls_ssl_set_bio(pmVar1,ctx_01,mbedtls_net_send,mbedtls_net_recv,mbedtls_net_recv_timeout);
      do {
        uVar7 = mbedtls_ssl_handshake(pmVar1);
        if (uVar7 == 0) {
          if (((pHVar4->tls).verify != '\0') &&
             (uVar8 = mbedtls_ssl_get_verify_result(pmVar1), uVar8 != 0)) {
            return -0x2700;
          }
          goto LAB_00111068;
        }
      } while ((uVar7 & 0xffffff7f) == 0xffff9700);
    }
    else {
LAB_00111068:
      uVar7 = 0;
    }
  }
  return uVar7;
}

Assistant:

static int https_connect(HTTP_INFO *hi, char *host, char *port)
{
    int ret, https;


    https = hi->url.https;

    if(https == 1)
    {
        mbedtls_entropy_init( &hi->tls.entropy );

        ret = mbedtls_ctr_drbg_seed( &hi->tls.ctr_drbg, mbedtls_entropy_func, &hi->tls.entropy, NULL, 0);
        if( ret != 0 )
        {
            return ret;
        }

        ca_crt_rsa[ca_crt_rsa_size - 1] = 0;
        ret = mbedtls_x509_crt_parse(&hi->tls.cacert, (uint8_t *)ca_crt_rsa, ca_crt_rsa_size);
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_config_defaults( &hi->tls.conf,
                                           MBEDTLS_SSL_IS_CLIENT,
                                           MBEDTLS_SSL_TRANSPORT_STREAM,
                                           MBEDTLS_SSL_PRESET_DEFAULT );
        if( ret != 0 )
        {
            return ret;
        }

        /* OPTIONAL is not optimal for security,
         * but makes interop easier in this simplified example */
        mbedtls_ssl_conf_authmode( &hi->tls.conf, MBEDTLS_SSL_VERIFY_OPTIONAL );
        mbedtls_ssl_conf_ca_chain( &hi->tls.conf, &hi->tls.cacert, NULL );
        mbedtls_ssl_conf_rng( &hi->tls.conf, mbedtls_ctr_drbg_random, &hi->tls.ctr_drbg );
        mbedtls_ssl_conf_read_timeout( &hi->tls.conf, 5000 );

        ret = mbedtls_ssl_setup( &hi->tls.ssl, &hi->tls.conf );
        if( ret != 0 )
        {
            return ret;
        }

        ret = mbedtls_ssl_set_hostname( &hi->tls.ssl, host );
        if( ret != 0 )
        {
            return ret;
        }
    }

    ret = mbedtls_net_connect_timeout(&hi->tls.ssl_fd, host, port, MBEDTLS_NET_PROTO_TCP, 5000);
    if( ret != 0 )
    {
        return ret;
    }

    if(https == 1)
    {
        mbedtls_ssl_set_bio(&hi->tls.ssl, &hi->tls.ssl_fd, mbedtls_net_send, mbedtls_net_recv, mbedtls_net_recv_timeout);

        while ((ret = mbedtls_ssl_handshake(&hi->tls.ssl)) != 0)
        {
            if (ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE)
            {
                return ret;
            }
        }

        /* In real life, we probably want to bail out when ret != 0 */
        if( hi->tls.verify && (mbedtls_ssl_get_verify_result(&hi->tls.ssl) != 0) )
        {
            return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
        }
    }

    return 0;
}